

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O3

void __thiscall argsman_tests::util_ReadWriteSettings::test_method(util_ReadWriteSettings *this)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  MatchFn match;
  int iVar4;
  mapped_type *pmVar5;
  string *this_00;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  const_string msg;
  undefined8 in_stack_fffffffffffff948;
  util_ReadWriteSettings *puVar6;
  code *pcVar7;
  _Manager_type p_Var8;
  _Invoker_type p_Var9;
  char *local_678;
  char *local_670;
  char *local_668;
  string *local_660;
  char *local_658;
  char *local_650;
  assertion_result local_648;
  unique_lock<std::recursive_mutex> local_630;
  unique_lock<std::recursive_mutex> local_620;
  undefined1 *local_610;
  char *local_608;
  path local_600;
  path local_5d8;
  path local_5b0;
  undefined1 local_588 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578 [2];
  pointer *local_558 [2];
  pointer local_548 [2];
  DebugLogHelper debugloghelper25;
  TestArgsManager args2;
  TestArgsManager args1;
  key_type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(&args1.super_ArgsManager);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&args1.super_ArgsManager.m_network_only_args._M_t);
  puVar1 = (undefined1 *)
           ((long)&args2.super_ArgsManager.cs_args.super_recursive_mutex.
                   super___recursive_mutex_base._M_mutex + 0x10);
  args2.super_ArgsManager.cs_args.super_recursive_mutex.super___recursive_mutex_base._M_mutex.
  __align = (long)puVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&args2,"-datadir","");
  pcVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_path_root.super_path._M_pathname._M_dataplus
           ._M_p;
  paVar2 = &debugloghelper25.m_message.field_2;
  debugloghelper25.m_message._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&debugloghelper25,pcVar3,
             pcVar3 + (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_path_root.super_path._M_pathname.
                      _M_string_length);
  ArgsManager::ForceSetArg(&args1.super_ArgsManager,(string *)&args2,&debugloghelper25.m_message);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)debugloghelper25.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(debugloghelper25.m_message._M_dataplus._M_p,
                    debugloghelper25.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)
      args2.super_ArgsManager.cs_args.super_recursive_mutex.super___recursive_mutex_base._M_mutex.
      __align != puVar1) {
    operator_delete((void *)args2.super_ArgsManager.cs_args.super_recursive_mutex.
                            super___recursive_mutex_base._M_mutex.__align,
                    args2.super_ArgsManager.cs_args.super_recursive_mutex.
                    super___recursive_mutex_base._M_mutex._16_8_ + 1);
  }
  local_620._M_owns = false;
  local_620._M_device = (mutex_type *)&args1.super_ArgsManager;
  std::unique_lock<std::recursive_mutex>::lock(&local_620);
  ::UniValue::UniValue<const_char_(&)[6],_char[6],_true>((UniValue *)&args2,(char (*) [6])0xe299b5);
  debugloghelper25.m_message._M_string_length = 4;
  debugloghelper25.m_message.field_2._M_allocated_capacity._0_5_ = 0x656d616e;
  debugloghelper25.m_message._M_dataplus._M_p = (pointer)paVar2;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           ::operator[](&args1.super_ArgsManager.m_settings.rw_settings,&debugloghelper25.m_message)
  ;
  pmVar5->typ = args2.super_ArgsManager.cs_args.super_recursive_mutex.super___recursive_mutex_base.
                _M_mutex.__data.__lock;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pmVar5->val,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&args2.super_ArgsManager.cs_args.super_recursive_mutex.
                     super___recursive_mutex_base._M_mutex + 8));
  local_578[0]._0_8_ =
       (pmVar5->keys).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_588._0_8_ =
       (pmVar5->keys).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_588._8_8_ =
       (pmVar5->keys).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pmVar5->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl._0_8_;
  (pmVar5->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pointer)args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.
                super__Rb_tree_header._M_header._0_8_;
  (pmVar5->keys).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.
                super__Rb_tree_header._M_header._M_parent;
  args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl._0_8_ = 0;
  args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_color = _S_red;
  args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header.
  _4_4_ = 0;
  args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_588);
  local_578[0]._0_8_ =
       (pmVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_588._0_8_ =
       (pmVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_588._8_8_ =
       (pmVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (pmVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.
                super__Rb_tree_header._M_header._M_left;
  (pmVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.
                super__Rb_tree_header._M_header._M_right;
  (pmVar5->values).super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.
                super__Rb_tree_header._M_node_count;
  args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_left = (_Base_ptr)0x0;
  args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_right = (_Base_ptr)0x0;
  args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)local_588);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)debugloghelper25.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(debugloghelper25.m_message._M_dataplus._M_p,
                    debugloghelper25.m_message.field_2._M_allocated_capacity + 1);
  }
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector
            ((vector<UniValue,_std::allocator<UniValue>_> *)
             ((long)&args2.super_ArgsManager.m_settings.forced_settings._M_t._M_impl.
                     super__Rb_tree_header + 0x10));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&args2.super_ArgsManager.m_settings);
  if ((undefined1 *)
      args2.super_ArgsManager.cs_args.super_recursive_mutex.super___recursive_mutex_base._M_mutex.
      _8_8_ != (undefined1 *)
               ((long)&args2.super_ArgsManager.cs_args.super_recursive_mutex.
                       super___recursive_mutex_base._M_mutex + 0x18)) {
    operator_delete((void *)args2.super_ArgsManager.cs_args.super_recursive_mutex.
                            super___recursive_mutex_base._M_mutex._8_8_,
                    (ulong)((long)&(args2.super_ArgsManager.cs_args.super_recursive_mutex.
                                    super___recursive_mutex_base._M_mutex.__data.__list.__prev)->
                                   __prev + 1));
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_620);
  ArgsManager::WriteSettingsFile
            (&args1.super_ArgsManager,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0,false);
  puVar6 = this;
  ArgsManager::ArgsManager(&args2.super_ArgsManager);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&args2.super_ArgsManager.m_network_only_args._M_t);
  debugloghelper25.m_message._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&debugloghelper25,"-datadir","");
  pcVar3 = (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_path_root.super_path._M_pathname._M_dataplus
           ._M_p;
  local_588._0_8_ = local_578;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_588,pcVar3,
             pcVar3 + (this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_path_root.super_path._M_pathname.
                      _M_string_length);
  ArgsManager::ForceSetArg(&args2.super_ArgsManager,&debugloghelper25.m_message,(string *)local_588)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_588._0_8_ != local_578) {
    operator_delete((void *)local_588._0_8_,(ulong)(local_578[0]._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)debugloghelper25.m_message._M_dataplus._M_p != paVar2) {
    operator_delete(debugloghelper25.m_message._M_dataplus._M_p,
                    debugloghelper25.m_message.field_2._M_allocated_capacity + 1);
  }
  ArgsManager::ReadSettingsFile
            (&args2.super_ArgsManager,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0);
  local_630._M_owns = false;
  local_630._M_device = (mutex_type *)&args2.super_ArgsManager;
  std::unique_lock<std::recursive_mutex>::lock(&local_630);
  local_678 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_670 = "";
  p_Var8 = (_Manager_type)&boost::unit_test::basic_cstring<char_const>::null;
  p_Var9 = (_Invoker_type)&boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x412;
  file.m_begin = (iterator)&local_678;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,
             (size_t)&stack0xfffffffffffff978,msg);
  local_620._M_owns = false;
  local_620._M_device = (mutex_type *)&PTR__lazy_ostream_01388f08;
  local_610 = boost::unit_test::lazy_ostream::inst;
  local_608 = "";
  local_58.field_2._M_allocated_capacity._0_4_ = 0x656d616e;
  local_58._M_string_length = 4;
  local_58.field_2._M_allocated_capacity._4_4_ =
       local_58.field_2._M_allocated_capacity._4_4_ & 0xffffff00;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
           ::operator[](&args2.super_ArgsManager.m_settings.rw_settings,&local_58);
  this_00 = ::UniValue::get_str_abi_cxx11_(pmVar5);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (this_00,"value");
  local_648.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar4 == 0);
  local_648.m_message.px = (element_type *)0x0;
  local_648.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_658 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/argsman_tests.cpp"
  ;
  local_650 = "";
  debugloghelper25.m_message.field_2._8_8_ = &local_660;
  debugloghelper25.m_message._M_string_length =
       debugloghelper25.m_message._M_string_length & 0xffffffffffffff00;
  debugloghelper25.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01388fc8;
  debugloghelper25.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_578[0]._8_8_ = &local_668;
  local_668 = "value";
  local_588._8_8_ = local_588._8_8_ & 0xffffffffffffff00;
  local_588._0_8_ = &PTR__lazy_ostream_01389498;
  local_578[0]._M_allocated_capacity = boost::unit_test::lazy_ostream::inst;
  local_660 = this_00;
  boost::test_tools::tt_detail::report_assertion
            (&local_648,(lazy_ostream *)&local_620,1,2,REQUIRE,0xe36856,(size_t)&local_658,0x412,
             &debugloghelper25,"\"value\"",local_588);
  boost::detail::shared_count::~shared_count(&local_648.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT44(local_58.field_2._M_allocated_capacity._4_4_,
                             local_58.field_2._M_allocated_capacity._0_4_) + 1);
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_630);
  local_558[0] = local_548;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_558,"Failed renaming settings file","");
  pcVar7 = std::
           _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
           ::_M_manager;
  match.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
       ::_M_invoke;
  match.super__Function_base._M_functor._M_unused._M_function_pointer =
       std::
       _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util/logging.h:35:66)>
       ::_M_manager;
  match.super__Function_base._M_manager = p_Var8;
  match._M_invoker = p_Var9;
  DebugLogHelper::DebugLogHelper
            (&debugloghelper25,(string)ZEXT1632(CONCAT88(puVar6,in_stack_fffffffffffff948)),match);
  if (pcVar7 != (code *)0x0) {
    (*pcVar7)(&stack0xfffffffffffff958,&stack0xfffffffffffff958,3);
  }
  if (local_558[0] != local_548) {
    operator_delete(local_558[0],(ulong)((long)&(local_548[0]->_M_dataplus)._M_p + 1));
  }
  ArgsManager::GetDataDir((path *)&local_5b0,&args1.super_ArgsManager,false);
  std::filesystem::__cxx11::path::_M_append(&local_5b0,0xd,"settings.json");
  std::filesystem::__cxx11::path::path((path *)local_588,&local_5b0);
  std::filesystem::remove((path *)local_588);
  std::filesystem::__cxx11::path::~path((path *)local_588);
  std::filesystem::__cxx11::path::~path(&local_5b0);
  ArgsManager::GetDataDir((path *)&local_5d8,&args1.super_ArgsManager,false);
  std::filesystem::__cxx11::path::_M_append(&local_5d8,0xd,"settings.json");
  std::filesystem::__cxx11::path::path((path *)local_588,&local_5d8);
  std::filesystem::create_directory((path *)local_588);
  std::filesystem::__cxx11::path::~path((path *)local_588);
  std::filesystem::__cxx11::path::~path(&local_5d8);
  ArgsManager::WriteSettingsFile
            (&args2.super_ArgsManager,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x0,false);
  ArgsManager::GetDataDir((path *)&local_600,&args1.super_ArgsManager,false);
  std::filesystem::__cxx11::path::_M_append(&local_600,0xd,"settings.json");
  std::filesystem::__cxx11::path::path((path *)local_588,&local_600);
  std::filesystem::remove((path *)local_588);
  std::filesystem::__cxx11::path::~path((path *)local_588);
  std::filesystem::__cxx11::path::~path(&local_600);
  DebugLogHelper::~DebugLogHelper(&debugloghelper25);
  ArgsManager::~ArgsManager(&args2.super_ArgsManager);
  ArgsManager::~ArgsManager(&args1.super_ArgsManager);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ReadWriteSettings)
{
    // Test writing setting.
    TestArgsManager args1;
    args1.ForceSetArg("-datadir", fs::PathToString(m_path_root));
    args1.LockSettings([&](common::Settings& settings) { settings.rw_settings["name"] = "value"; });
    args1.WriteSettingsFile();

    // Test reading setting.
    TestArgsManager args2;
    args2.ForceSetArg("-datadir", fs::PathToString(m_path_root));
    args2.ReadSettingsFile();
    args2.LockSettings([&](common::Settings& settings) { BOOST_CHECK_EQUAL(settings.rw_settings["name"].get_str(), "value"); });

    // Test error logging, and remove previously written setting.
    {
        ASSERT_DEBUG_LOG("Failed renaming settings file");
        fs::remove(args1.GetDataDirBase() / "settings.json");
        fs::create_directory(args1.GetDataDirBase() / "settings.json");
        args2.WriteSettingsFile();
        fs::remove(args1.GetDataDirBase() / "settings.json");
    }
}